

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O2

UTrie2 * utrie2_cloneAsThawed_63(UTrie2 *other,UErrorCode *pErrorCode)

{
  uint uVar1;
  UNewTrie2 *pUVar2;
  UTrie2 *pUVar3;
  uint32_t value;
  uint c;
  UTrie2 *local_30;
  UErrorCode local_28;
  undefined1 local_24;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UTrie2 *)0x0;
  }
  if (other == (UTrie2 *)0x0) {
LAB_002c34d4:
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (UTrie2 *)0x0;
  }
  pUVar2 = other->newTrie;
  if (other->memory == (void *)0x0) {
    if (pUVar2 == (UNewTrie2 *)0x0) goto LAB_002c34d4;
  }
  else if (pUVar2 == (UNewTrie2 *)0x0) goto LAB_002c3445;
  if (pUVar2->isCompacted == '\0') {
    pUVar3 = utrie2_clone_63(other,pErrorCode);
    return pUVar3;
  }
LAB_002c3445:
  local_30 = utrie2_open_63(other->initialValue,other->errorValue,pErrorCode);
  local_28 = *pErrorCode;
  if (local_28 < U_ILLEGAL_ARGUMENT_ERROR) {
    local_24 = 0;
    utrie2_enum_63(other,(UTrie2EnumValue *)0x0,copyEnumRange,&local_30);
    *pErrorCode = local_28;
    for (c = 0xd800; c != 0xdc00; c = c + 1) {
      uVar1 = (c & 0x1f) + (uint)other->index[c >> 5] * 4;
      if (other->data32 == (uint32_t *)0x0) {
        value = (uint32_t)other->index[uVar1];
      }
      else {
        value = other->data32[uVar1];
      }
      if (value != other->initialValue) {
        utrie2_set32ForLeadSurrogateCodeUnit_63(local_30,c,value,pErrorCode);
      }
    }
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      return local_30;
    }
    utrie2_close_63(local_30);
  }
  return (UTrie2 *)0x0;
}

Assistant:

U_CAPI void U_EXPORT2
utrie2_set32ForLeadSurrogateCodeUnit(UTrie2 *trie,
                                     UChar32 c, uint32_t value,
                                     UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return;
    }
    if(!U_IS_LEAD(c)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    set32(trie->newTrie, c, FALSE, value, pErrorCode);
}